

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

void Iso_ReadPrimes(char *pFileName)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  int *piVar9;
  int Nums [10000];
  
  piVar7 = Nums;
  piVar9 = Nums;
  __stream = fopen(pFileName,"rb");
  uVar4 = 0xffffffffffffffff;
  do {
    uVar3 = uVar4;
    iVar1 = __isoc99_fscanf(__stream,"%d",piVar7);
    uVar4 = uVar3 + 1;
    piVar7 = (int *)((long)piVar7 + 4);
  } while (iVar1 == 1);
  fclose(__stream);
  if (0x3fe < uVar4) {
    srand(0x6f);
    for (uVar8 = 0xffffffffffffffff; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      iVar2 = rand();
      iVar2 = iVar2 % ((int)uVar3 + 2);
      iVar1 = Nums[uVar8 + 1];
      Nums[uVar8 + 1] = Nums[iVar2];
      Nums[iVar2] = iVar1;
    }
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
      printf("    ");
      for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
        printf("%d,",(ulong)*(uint *)((long)piVar9 + lVar6 * 4));
      }
      putchar(10);
      piVar9 = (int *)((long)piVar9 + 0x40);
    }
    return;
  }
  __assert_fail("nSize >= (1<<10)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                ,0x14e,"void Iso_ReadPrimes(char *)");
}

Assistant:

void Iso_ReadPrimes( char * pFileName )
{
    FILE * pFile;
    int Nums[10000];
    int i, j, Temp, nSize = 0;
    // read the numbers
    pFile = fopen( pFileName, "rb" );
    while ( fscanf( pFile, "%d", Nums + nSize++ ) == 1 );
    fclose( pFile );
    assert( nSize >= (1<<10) );
    // randomly permute
    srand( 111 );
    for ( i = 0; i < nSize; i++ )
    {
        j = rand() % nSize;
        Temp = Nums[i];
        Nums[i] = Nums[j];
        Nums[j] = Temp;
    }
    // write out
    for ( i = 0; i < 64; i++ )
    {
        printf( "    " );
        for ( j = 0; j < 16; j++ )
            printf( "%d,", Nums[i*16+j] );
        printf( "\n" );
    }
}